

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdom.cpp
# Opt level: O3

void __thiscall
QDomEntityPrivate::QDomEntityPrivate
          (QDomEntityPrivate *this,QDomDocumentPrivate *d,QDomNodePrivate *parent,QString *aname,
          QString *pub,QString *sys,QString *notation)

{
  byte bVar1;
  
  bVar1 = (this->super_QDomNodePrivate).field_0x98;
  (this->super_QDomNodePrivate).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
  _q_value.super___atomic_base<int>._M_i = 1;
  (this->super_QDomNodePrivate).name.d.d = (Data *)0x0;
  (this->super_QDomNodePrivate).name.d.ptr = (char16_t *)0x0;
  (this->super_QDomNodePrivate).name.d.size = 0;
  (this->super_QDomNodePrivate).value.d.d = (Data *)0x0;
  (this->super_QDomNodePrivate).value.d.ptr = (char16_t *)0x0;
  (this->super_QDomNodePrivate).value.d.size = 0;
  (this->super_QDomNodePrivate).prefix.d.d = (Data *)0x0;
  (this->super_QDomNodePrivate).prefix.d.ptr = (char16_t *)0x0;
  (this->super_QDomNodePrivate).prefix.d.size = 0;
  (this->super_QDomNodePrivate).namespaceURI.d.d = (Data *)0x0;
  (this->super_QDomNodePrivate).namespaceURI.d.ptr = (char16_t *)0x0;
  (this->super_QDomNodePrivate).namespaceURI.d.size = 0;
  if (parent != (QDomNodePrivate *)0x0) {
    d = (QDomDocumentPrivate *)parent;
  }
  (this->super_QDomNodePrivate).ownerNode = &d->super_QDomNodePrivate;
  (this->super_QDomNodePrivate).prev = (QDomNodePrivate *)0x0;
  (this->super_QDomNodePrivate).next = (QDomNodePrivate *)0x0;
  (this->super_QDomNodePrivate).first = (QDomNodePrivate *)0x0;
  (this->super_QDomNodePrivate).last = (QDomNodePrivate *)0x0;
  (this->super_QDomNodePrivate).field_0x98 =
       ((parent != (QDomNodePrivate *)0x0) * '\x02' | bVar1 & 0xfc) + 1;
  (this->super_QDomNodePrivate).lineNumber = -1;
  (this->super_QDomNodePrivate).columnNumber = -1;
  (this->super_QDomNodePrivate)._vptr_QDomNodePrivate =
       (_func_int **)&PTR__QDomEntityPrivate_001294a0;
  (this->m_sys).d.d = (Data *)0x0;
  (this->m_sys).d.ptr = (char16_t *)0x0;
  (this->m_sys).d.size = 0;
  (this->m_pub).d.d = (Data *)0x0;
  (this->m_pub).d.ptr = (char16_t *)0x0;
  (this->m_pub).d.size = 0;
  (this->m_notationName).d.d = (Data *)0x0;
  (this->m_notationName).d.ptr = (char16_t *)0x0;
  (this->m_notationName).d.size = 0;
  QString::operator=(&(this->super_QDomNodePrivate).name,aname);
  QString::operator=(&this->m_pub,pub);
  QString::operator=(&this->m_sys,sys);
  QString::operator=(&this->m_notationName,notation);
  return;
}

Assistant:

QDomEntityPrivate::QDomEntityPrivate(QDomDocumentPrivate* d, QDomNodePrivate* parent,
                                        const QString& aname,
                                        const QString& pub, const QString& sys, const QString& notation)
    : QDomNodePrivate(d, parent)
{
    name = aname;
    m_pub = pub;
    m_sys = sys;
    m_notationName = notation;
}